

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_critbit.c
# Opt level: O3

void test_foreach(CuTest *tc)

{
  int iVar1;
  int counter;
  char *prev;
  critbit_tree cb;
  int local_44;
  undefined8 local_40;
  critbit_tree local_38;
  
  local_38.root = (void *)0x0;
  local_44 = 0;
  iVar1 = cb_foreach(&local_38,"herpderp",8,count_cb,&local_44);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xd5,(char *)0x0,0,iVar1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xd6,(char *)0x0,0,local_44);
  cb_insert(&local_38,"herp",5);
  local_44 = 0;
  iVar1 = cb_foreach(&local_38,"herpderp",8,count_cb,&local_44);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xdd,(char *)0x0,0,iVar1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xde,(char *)0x0,0,local_44);
  local_44 = 0;
  iVar1 = cb_foreach(&local_38,"",0,count_cb,&local_44);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xe2,(char *)0x0,0,iVar1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xe3,(char *)0x0,1,local_44);
  cb_insert(&local_38,"derp",5);
  cb_insert(&local_38,"herpes",7);
  cb_insert(&local_38,"herpderp",9);
  local_44 = 0;
  iVar1 = cb_foreach(&local_38,"",0,count_cb,&local_44);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xeb,(char *)0x0,0,iVar1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xec,(char *)0x0,4,local_44);
  local_44 = 0;
  iVar1 = cb_foreach(&local_38,"herp",0,count_cb,&local_44);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xf0,(char *)0x0,0,iVar1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xf1,(char *)0x0,4,local_44);
  local_40 = 0;
  iVar1 = cb_foreach(&local_38,"",0,ordered_cb,&local_40);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xf6,(char *)0x0,0,iVar1);
  return;
}

Assistant:

static void test_foreach(CuTest * tc)
{
  critbit_tree cb = CRITBIT_TREE();
  int result, counter;
  const char * prev;

  counter = 0;
  result = cb_foreach(&cb, "herpderp", strlen("herpderp"), count_cb, &counter);
  CuAssertIntEquals(tc, 0, result);
  CuAssertIntEquals(tc, 0, counter);

  result = cb_insert_str(&cb, "herp");

  /* try finding a string that is longer than any in the tree */
  counter = 0;
  result = cb_foreach(&cb, "herpderp", strlen("herpderp"), count_cb, &counter);
  CuAssertIntEquals(tc, 0, result);
  CuAssertIntEquals(tc, 0, counter);

  counter = 0;
  result = cb_foreach(&cb, "", 0, count_cb, &counter);
  CuAssertIntEquals(tc, 0, result);
  CuAssertIntEquals(tc, 1, counter);

  result = cb_insert_str(&cb, "derp");
  result = cb_insert_str(&cb, "herpes");
  result = cb_insert_str(&cb, "herpderp");

  counter = 0;
  result = cb_foreach(&cb, "", 0, count_cb, &counter);
  CuAssertIntEquals(tc, 0, result);
  CuAssertIntEquals(tc, 4, counter);

  counter = 0;
  result = cb_foreach(&cb, "herp", 0, count_cb, &counter);
  CuAssertIntEquals(tc, 0, result);
  CuAssertIntEquals(tc, 4, counter);

  /* keys should be processed in order */
  prev = 0;
  result = cb_foreach(&cb, "", 0, ordered_cb, (void *)&prev);
  CuAssertIntEquals(tc, 0, result);
}